

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLEScanPartialInternal<unsigned_short,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  unsigned_short uVar1;
  idx_t iVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  idx_t iVar5;
  RLEScanState<unsigned_short> *scan_state;
  data_ptr_t pdVar6;
  ulong uVar7;
  ulong uVar8;
  rle_count_t *index_pointer;
  ulong uVar9;
  
  scan_state = (RLEScanState<unsigned_short> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  pdVar6 = BufferHandle::Ptr(&scan_state->handle);
  iVar2 = segment->offset;
  index_pointer = (rle_count_t *)(pdVar6 + scan_state->rle_count_offset + iVar2);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<unsigned_short>
              (scan_state,index_pointer,(unsigned_short *)(pdVar6 + iVar2 + 8),0x800,result);
    return;
  }
  pdVar3 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar9 = scan_count + result_offset;
  while( true ) {
    uVar7 = uVar9 - result_offset;
    if (uVar9 < result_offset || uVar7 == 0) {
      return;
    }
    iVar4 = scan_state->entry_pos;
    iVar5 = scan_state->position_in_entry;
    uVar8 = index_pointer[iVar4] - iVar5;
    uVar1 = *(unsigned_short *)((long)(pdVar6 + iVar2 + 8) + iVar4 * 2);
    if (uVar7 < uVar8) break;
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      *(unsigned_short *)(pdVar3 + uVar7 * 2 + result_offset * 2) = uVar1;
    }
    result_offset = result_offset + uVar8;
    scan_state->entry_pos = iVar4 + 1;
    scan_state->position_in_entry = 0;
  }
  for (; uVar9 != result_offset; result_offset = result_offset + 1) {
    *(unsigned_short *)(pdVar3 + result_offset * 2) = uVar1;
  }
  scan_state->position_in_entry = iVar5 + uVar7;
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}